

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.h
# Opt level: O0

char * __thiscall
Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator::Alloc
          (DictAllocator *this,size_t requestedBytes)

{
  bool bVar1;
  char *data;
  JITManager *this_00;
  DataChunk *pDVar2;
  DataChunk *chunk;
  char *dataBlock;
  size_t requestedBytes_local;
  DictAllocator *this_local;
  
  data = NativeCodeData::Allocator::Alloc(&this->super_Allocator,requestedBytes);
  this_00 = JITManager::GetJITManager();
  bVar1 = JITManager::IsJITServer(this_00);
  if (bVar1) {
    pDVar2 = NativeCodeData::GetDataChunk(data);
    pDVar2->dataType = "BranchDictionary::Bucket";
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,NativeCodeDataPhase);
    if (bVar1) {
      Output::Print(L"NativeCodeData BranchDictionary::Bucket: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"
                    ,pDVar2,data,(ulong)pDVar2->allocIndex,(ulong)pDVar2->len,(ulong)pDVar2->offset,
                    pDVar2->dataType);
    }
  }
  return data;
}

Assistant:

char * Alloc(size_t requestedBytes)
            {
                char* dataBlock = __super::Alloc(requestedBytes);
#if DBG
                if (JITManager::GetJITManager()->IsJITServer())
                {
                    NativeCodeData::DataChunk* chunk = NativeCodeData::GetDataChunk(dataBlock);
                    chunk->dataType = "BranchDictionary::Bucket";
                    if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                    {
                        Output::Print(_u("NativeCodeData BranchDictionary::Bucket: chunk: %p, data: %p, index: %d, len: %x, totalOffset: %x, type: %S\n"),
                            chunk, (void*)dataBlock, chunk->allocIndex, chunk->len, chunk->offset, chunk->dataType);
                    }
                }
#endif
                return dataBlock;
            }